

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O3

void EBPLM::PredictStateOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *wmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  BCRec *bcrec;
  long lVar30;
  double *pdVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  EBCellFlag *pEVar53;
  long lVar54;
  long lVar55;
  double *pdVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  double *pdVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  undefined8 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  pair<bool,_bool> pVar81;
  pair<bool,_bool> pVar82;
  pair<bool,_bool> pVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  uint uVar89;
  long lVar90;
  ulong uVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  ulong uVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  Long *pLVar111;
  long lVar112;
  int iVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  int iVar121;
  int iVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  char cVar130;
  int jj;
  int iVar131;
  int iVar132;
  long lVar133;
  long lVar134;
  int iVar135;
  int iVar136;
  double *pdVar137;
  double *pdVar138;
  bool bVar139;
  uint uVar140;
  long lVar141;
  long lVar142;
  double *pdVar143;
  double *pdVar144;
  long lVar145;
  long lVar146;
  int iVar147;
  long lVar148;
  long lVar149;
  double **ppdVar150;
  char cVar151;
  int kk_1;
  uint uVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  long lVar157;
  double *pdVar158;
  double *pdVar159;
  long lVar160;
  int iVar161;
  int iVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  long lVar166;
  long lVar167;
  int iVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  long lVar172;
  long lVar173;
  int iVar174;
  long lVar175;
  int iVar176;
  int iVar177;
  long lVar178;
  long lVar179;
  long lVar180;
  bool bVar181;
  ulong uVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  ulong uVar186;
  double dVar187;
  double dVar188;
  undefined1 auVar189 [16];
  double dVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  Real delta_z;
  double dVar195;
  double dVar196;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  double dVar197;
  ulong uVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  Real delta_y;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  Real delta_x;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  Real A [27] [3];
  Real du [27];
  double local_8a8;
  ulong local_890;
  double *local_810;
  double *local_740;
  double *local_738;
  double *local_730;
  anon_class_688_19_da5fa63c local_3b8;
  double adStack_108 [27];
  
  dVar183 = dt / (geom->super_CoordSys).dx[1];
  iVar177 = (geom->domain).smallend.vect[0];
  iVar162 = (geom->domain).smallend.vect[1];
  iVar168 = (geom->domain).bigend.vect[0];
  iVar3 = (geom->domain).bigend.vect[1];
  iVar4 = (geom->domain).smallend.vect[2];
  iVar5 = (geom->domain).bigend.vect[2];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pVar81 = anon_unknown.dwarf_653e0d::has_extdir_or_ho(bcrec,ncomp,0);
  pVar82 = anon_unknown.dwarf_653e0d::has_extdir_or_ho(bcrec,ncomp,1);
  pVar83 = anon_unknown.dwarf_653e0d::has_extdir_or_ho(bcrec,ncomp,2);
  if ((((((((ushort)pVar81 & 1) == 0) || (iVar177 < (zebox->smallend).vect[0] + -1)) &&
        (iVar6 = (zebox->bigend).vect[0], iVar6 < iVar168 || ((ushort)pVar81 >> 8 & 1) == 0)) &&
       ((((ushort)pVar83 & 1) == 0 || (iVar4 < (zebox->smallend).vect[2] + -1)))) &&
      (iVar7 = (zebox->bigend).vect[2], iVar7 < iVar5 || ((ushort)pVar83 >> 8 & 1) == 0)) &&
     (((((ushort)pVar82 & 1) == 0 || (iVar162 < (zebox->smallend).vect[1] + -1)) &&
      (iVar8 = (zebox->bigend).vect[1], iVar8 < iVar3 || ((ushort)pVar82 >> 8 & 1) == 0)))) {
    if (0 < ncomp) {
      lVar30 = ccc->nstride;
      iVar177 = (ccc->begin).x;
      lVar114 = (long)iVar177;
      pdVar31 = ccc->p;
      iVar162 = (q->begin).x;
      lVar175 = (long)iVar162;
      iVar168 = (zebox->smallend).vect[0];
      lVar90 = (long)iVar168;
      pdVar32 = q->p;
      lVar33 = q->jstride;
      lVar34 = q->kstride;
      lVar35 = q->nstride;
      iVar3 = (q->begin).y;
      uVar91 = (ulong)iVar3;
      iVar4 = (q->begin).z;
      lVar92 = (long)iVar4;
      lVar36 = ccc->jstride;
      lVar37 = ccc->kstride;
      iVar5 = (ccc->begin).y;
      iVar9 = (ccc->begin).z;
      pdVar38 = fcz->p;
      lVar39 = fcz->jstride;
      lVar40 = fcz->kstride;
      lVar41 = fcz->nstride;
      iVar10 = (fcz->begin).z;
      iVar11 = (fcz->begin).y;
      lVar169 = (long)(fcz->begin).x;
      pdVar42 = fcy->p;
      lVar43 = fcy->jstride;
      lVar44 = fcy->kstride;
      lVar45 = fcy->nstride;
      iVar136 = (fcy->begin).y;
      lVar170 = (long)(fcy->begin).z;
      lVar171 = (long)(fcy->begin).x;
      pdVar46 = fcx->p;
      lVar47 = fcx->jstride;
      lVar48 = fcx->kstride;
      lVar49 = fcx->nstride;
      lVar172 = (long)(fcx->begin).z;
      iVar12 = (fcx->begin).y;
      iVar13 = (fcx->begin).x;
      pdVar50 = vfrac->p;
      lVar51 = vfrac->jstride;
      lVar52 = vfrac->kstride;
      uVar14 = (vfrac->begin).y;
      lVar173 = (long)(int)uVar14;
      iVar15 = (vfrac->begin).z;
      lVar163 = (long)iVar15;
      uVar16 = (vfrac->begin).x;
      lVar164 = (long)(int)uVar16;
      pEVar53 = flag->p;
      lVar54 = flag->jstride;
      lVar55 = flag->kstride;
      lVar178 = (long)(flag->begin).z;
      iVar17 = (flag->begin).y;
      iVar18 = (flag->begin).x;
      pdVar56 = Ipz->p;
      lVar57 = Ipz->jstride;
      lVar58 = Ipz->kstride;
      lVar59 = Ipz->nstride;
      uVar19 = (Ipz->begin).z;
      iVar20 = (Ipz->begin).y;
      iVar21 = (Ipz->begin).x;
      pdVar60 = Imz->p;
      lVar61 = Imz->jstride;
      lVar62 = Imz->kstride;
      lVar63 = Imz->nstride;
      iVar22 = (Imz->begin).z;
      iVar23 = (Imz->begin).y;
      iVar24 = (Imz->begin).x;
      pdVar64 = wmac->p;
      lVar65 = wmac->jstride;
      lVar66 = wmac->kstride;
      iVar25 = (wmac->begin).z;
      iVar26 = (wmac->begin).y;
      lVar148 = (long)(wmac->begin).x;
      iVar27 = (zebox->smallend).vect[2];
      iVar28 = (zebox->smallend).vect[1];
      local_810 = pdVar32 + ((lVar90 + -1) - lVar175);
      local_890 = 0;
      do {
        if (iVar27 <= iVar7) {
          lVar115 = local_890 * lVar35;
          lVar112 = (long)iVar27;
          do {
            if (iVar28 <= iVar8) {
              lVar2 = lVar112 + -1;
              lVar134 = lVar112 + -2;
              lVar93 = lVar112 + 1;
              lVar153 = (lVar112 - lVar163) * lVar52;
              lVar154 = (lVar2 - lVar163) * lVar52;
              lVar155 = (lVar134 - lVar163) * lVar52;
              lVar156 = (lVar93 - lVar163) * lVar52;
              lVar179 = (lVar112 - lVar92) * lVar34;
              lVar180 = (lVar112 - iVar25) * lVar66;
              lVar165 = (lVar2 - lVar92) * lVar34;
              lVar166 = (lVar93 - lVar92) * lVar34;
              lVar167 = (lVar134 - lVar92) * lVar34;
              lVar141 = (lVar112 - iVar10) * lVar40;
              lVar123 = (lVar112 - iVar9) * lVar37;
              iVar174 = (int)lVar112;
              iVar121 = iVar174 - iVar4;
              lVar124 = iVar121 * lVar34;
              lVar125 = (lVar112 - lVar170) * lVar44;
              lVar126 = (lVar112 - lVar172) * lVar48;
              iVar131 = (int)lVar93;
              lVar127 = (iVar131 - iVar15) * lVar52;
              lVar128 = ((int)lVar134 - iVar15) * lVar52;
              lVar93 = ((int)lVar134 - iVar4) * lVar34;
              iVar84 = (int)lVar2 - iVar9;
              iVar85 = (int)lVar2 - iVar4;
              lVar94 = iVar85 * lVar34;
              lVar95 = (lVar2 - lVar170) * lVar44;
              lVar96 = (lVar2 - lVar172) * lVar48;
              lVar97 = (~(long)iVar9 + lVar112) * lVar37;
              lVar134 = (long)iVar28;
              do {
                if (iVar6 < iVar168) {
                  uVar98 = lVar134 + 1U & 0xffffffff;
                }
                else {
                  lVar99 = (lVar134 - iVar17) * lVar54;
                  lVar100 = (lVar134 - lVar173) * lVar51;
                  lVar101 = (lVar134 - uVar91) * lVar33;
                  lVar102 = (lVar134 - iVar26) * lVar65;
                  lVar103 = (lVar134 - iVar11) * lVar39;
                  lVar104 = (lVar134 - iVar5) * lVar36;
                  iVar132 = (int)lVar134;
                  iVar86 = iVar132 - iVar3;
                  lVar105 = iVar86 * lVar33;
                  lVar106 = ((lVar134 + -1) - lVar173) * lVar51;
                  uVar98 = lVar134 + 1;
                  lVar116 = (uVar98 - lVar173) * lVar51;
                  lVar129 = ((lVar134 + -1) - uVar91) * lVar33;
                  lVar142 = (uVar98 - uVar91) * lVar33;
                  lVar145 = ((int)uVar98 - iVar136) * lVar43;
                  lVar146 = (lVar134 - iVar136) * lVar43;
                  lVar149 = (lVar134 - iVar12) * lVar47;
                  lVar157 = (int)(~uVar14 + iVar132) * lVar51;
                  lVar160 = (int)((int)uVar98 - uVar14) * lVar51;
                  lVar107 = (~(long)iVar5 + lVar134) * lVar36;
                  lVar117 = lVar90 + lVar97 + lVar107;
                  local_730 = pdVar31 + ((lVar107 + lVar97 + lVar30 + lVar90 + -1) - lVar114);
                  local_738 = pdVar31 + ((lVar30 * 2 + lVar117 + -1) - lVar114);
                  local_740 = pdVar31 + ((lVar117 + -1) - lVar114);
                  lVar117 = (long)local_810 +
                            (lVar134 + ~uVar91) * lVar33 * 8 +
                            (lVar112 + (-2 - lVar92)) * lVar34 * 8;
                  lVar107 = lVar90;
                  iVar161 = (iVar168 + -1) - iVar162;
                  iVar80 = (iVar168 + -1) - iVar177;
                  do {
                    lVar108 = lVar107 - iVar18;
                    uVar29 = pEVar53[lVar99 + lVar108 + (lVar112 - lVar178) * lVar55].flag;
                    dVar184 = 0.0;
                    dVar209 = 0.0;
                    if ((uVar29 >> 9 & 1) != 0) {
                      lVar118 = lVar107 - lVar164;
                      dVar190 = pdVar50[lVar100 + lVar118 + lVar153];
                      iVar87 = (int)lVar107;
                      if ((((dVar190 != 1.0) || (NAN(dVar190))) ||
                          (pdVar50[lVar100 + lVar118 + lVar154] != 1.0)) ||
                         (NAN(pdVar50[lVar100 + lVar118 + lVar154]))) {
LAB_0033d572:
                        lVar109 = lVar107 - lVar169;
                        dVar209 = pdVar38[lVar103 + lVar109 + lVar141];
                        dVar202 = (pdVar38 + lVar103 + lVar109 + lVar141)[lVar41];
                        lVar110 = lVar107 - lVar114;
                        dVar200 = pdVar31[lVar123 + lVar104 + lVar110 + lVar30 * 2];
                        dVar188 = pdVar31[lVar123 + lVar104 + lVar110];
                        dVar187 = pdVar31[lVar123 + lVar104 + lVar110 + lVar30];
                        lVar119 = (long)(iVar87 - iVar162);
                        dVar201 = pdVar32[lVar105 + lVar119 + lVar124 + lVar115];
                        dVar212 = pdVar32[lVar105 + lVar119 + lVar165 + lVar115];
                        lVar120 = -1;
                        cVar151 = '\x05';
                        lVar110 = 0;
                        pdVar137 = local_740;
                        pdVar143 = local_738;
                        pdVar158 = local_730;
                        do {
                          lVar133 = -1;
                          pdVar138 = pdVar137;
                          pdVar144 = pdVar143;
                          pdVar159 = pdVar158;
                          cVar130 = cVar151;
                          do {
                            iVar88 = (int)lVar110;
                            ppdVar150 = &local_3b8.q.p + (long)iVar88 * 3;
                            lVar110 = 0;
                            do {
                              iVar113 = (int)lVar110 + -1;
                              if ((((int)lVar133 == 0 && (int)lVar120 == 0) && iVar113 == 0) ||
                                 ((1 << (cVar130 + (char)lVar110 & 0x1fU) & uVar29) == 0)) {
                                *ppdVar150 = (double *)0x0;
                                ppdVar150[1] = (double *)0x0;
                                ppdVar150[2] = (double *)0x0;
                              }
                              else {
                                dVar184 = pdVar159[lVar110];
                                *ppdVar150 = (double *)
                                             ((pdVar138[lVar110] + (double)iVar113) - dVar188);
                                ppdVar150[1] = (double *)
                                               ((dVar184 + (double)(int)lVar133) - dVar187);
                                ppdVar150[2] = (double *)
                                               ((pdVar144[lVar110] + (double)(int)lVar120) - dVar200
                                               );
                              }
                              lVar110 = lVar110 + 1;
                              ppdVar150 = ppdVar150 + 3;
                            } while (lVar110 != 3);
                            lVar133 = lVar133 + 1;
                            pdVar144 = pdVar144 + lVar36;
                            pdVar159 = pdVar159 + lVar36;
                            pdVar138 = pdVar138 + lVar36;
                            cVar130 = cVar130 + '\x03';
                            lVar110 = (long)iVar88 + 3;
                          } while (lVar133 != 2);
                          lVar120 = lVar120 + 1;
                          pdVar143 = pdVar143 + lVar37;
                          pdVar158 = pdVar158 + lVar37;
                          pdVar137 = pdVar137 + lVar37;
                          cVar151 = cVar151 + '\t';
                          lVar110 = (long)iVar88 + 3;
                        } while (lVar120 != 2);
                        lVar120 = -1;
                        cVar151 = '\x05';
                        lVar110 = 0;
                        do {
                          lVar133 = -1;
                          cVar130 = cVar151;
                          do {
                            iVar88 = (int)lVar110;
                            lVar110 = 0;
                            do {
                              dVar184 = 0.0;
                              if (((int)lVar110 != 1 || ((int)lVar133 != 0 || (int)lVar120 != 0)) &&
                                 ((1 << (cVar130 + (char)lVar110 & 0x1fU) & uVar29) != 0)) {
                                dVar184 = pdVar32[lVar115 + (iVar121 + (int)lVar120) * lVar34 +
                                                            (iVar86 + (int)lVar133) * lVar33 +
                                                            (long)(iVar161 + (int)lVar110)] -
                                          dVar201;
                              }
                              adStack_108[iVar88 + lVar110] = dVar184;
                              lVar110 = lVar110 + 1;
                            } while (lVar110 != 3);
                            lVar133 = lVar133 + 1;
                            cVar130 = cVar130 + '\x03';
                            lVar110 = (long)iVar88 + 3;
                          } while (lVar133 != 2);
                          lVar120 = lVar120 + 1;
                          cVar151 = cVar151 + '\t';
                          lVar110 = (long)iVar88 + 3;
                        } while (lVar120 != 2);
                        dVar202 = dVar202 - dVar187;
                        dVar184 = 0.0;
                        dVar195 = 0.0;
                        dVar203 = 0.0;
                        pLVar111 = &local_3b8.q.kstride;
                        lVar110 = 0;
                        dVar211 = 0.0;
                        dVar213 = 0.0;
                        dVar208 = 0.0;
                        dVar210 = 0.0;
                        dVar197 = 0.0;
                        dVar199 = 0.0;
                        do {
                          pdVar137 = ((Array4<const_double> *)(pLVar111 + -2))->p;
                          dVar204 = (double)pLVar111[-1];
                          dVar185 = (double)*pLVar111;
                          dVar196 = adStack_108[lVar110];
                          dVar197 = dVar197 + dVar204 * (double)pLVar111[-1];
                          dVar199 = dVar199 + (double)pdVar137 * (double)*pLVar111;
                          dVar203 = dVar203 + dVar185 * dVar185;
                          dVar208 = dVar208 + dVar196 * (double)pdVar137;
                          dVar210 = dVar210 + (double)pdVar137 * (double)pdVar137;
                          dVar184 = dVar184 + dVar196 * dVar204;
                          dVar195 = dVar195 + dVar204 * (double)pdVar137;
                          dVar211 = dVar211 + dVar185 * (double)pLVar111[-1];
                          dVar213 = dVar213 + dVar196 * (double)*pLVar111;
                          lVar110 = lVar110 + 1;
                          pLVar111 = pLVar111 + 3;
                        } while (lVar110 != 0x1b);
                        dVar185 = dVar195 * dVar203 - dVar199 * dVar211;
                        dVar196 = dVar195 * dVar213 - dVar199 * dVar184;
                        dVar206 = dVar195 * dVar211 + dVar199 * -dVar197;
                        dVar204 = dVar203 * dVar197 - dVar211 * dVar211;
                        dVar203 = dVar203 * dVar184 - dVar211 * dVar213;
                        auVar191._0_8_ =
                             dVar199 * (dVar184 * dVar211 - dVar213 * dVar197) +
                             (dVar208 * dVar204 - dVar203 * dVar195);
                        auVar191._8_8_ = dVar199 * dVar196 + (dVar210 * dVar203 - dVar185 * dVar208)
                        ;
                        dVar199 = dVar206 * dVar199 + (dVar204 * dVar210 - dVar185 * dVar195);
                        auVar192._8_8_ = dVar199;
                        auVar192._0_8_ = dVar199;
                        auVar192 = divpd(auVar191,auVar192);
                        dVar199 = (dVar206 * dVar208 +
                                  ((dVar213 * dVar197 + -dVar184 * dVar211) * dVar210 -
                                  dVar196 * dVar195)) / dVar199;
                        dVar195 = auVar192._0_8_;
                        dVar197 = auVar192._8_8_;
                        if ((dVar190 == 1.0) && (!NAN(dVar190))) {
                          if ((pdVar50[lVar100 + lVar153 + ((lVar107 + -1) - lVar164)] == 1.0) &&
                             (!NAN(pdVar50[lVar100 + lVar153 + ((lVar107 + -1) - lVar164)]))) {
                            if ((pdVar50[lVar100 + lVar153 + ((lVar107 + 1) - lVar164)] == 1.0) &&
                               (!NAN(pdVar50[lVar100 + lVar153 + ((lVar107 + 1) - lVar164)]))) {
                              dVar208 = dVar201 - pdVar32[lVar105 + lVar124 + lVar115 + ((lVar107 +
                                                                                         -1) - 
                                                  lVar175)];
                              dVar210 = pdVar32[lVar105 + lVar124 + lVar115 + ((lVar107 + 1) -
                                                                              lVar175)] - dVar201;
                              dVar208 = dVar208 + dVar208;
                              dVar210 = dVar210 + dVar210;
                              dVar184 = (pdVar32[lVar105 + lVar124 + lVar115 + ((lVar107 + 1) -
                                                                               lVar175)] -
                                        pdVar32[lVar105 + lVar124 + lVar115 + ((lVar107 + -1) -
                                                                              lVar175)]) * 0.5;
                              dVar203 = ABS(dVar208);
                              uVar182 = -(ulong)(0.0 < dVar184);
                              dVar184 = ABS(dVar184);
                              dVar195 = ABS(dVar210);
                              if (dVar203 <= dVar184) {
                                dVar184 = dVar203;
                              }
                              if (dVar184 <= dVar195) {
                                dVar195 = dVar184;
                              }
                              uVar186 = -(ulong)(0.0 < dVar208 * dVar210) & (ulong)dVar195;
                              dVar195 = (double)(~uVar182 & (uVar186 ^ 0x8000000000000000) |
                                                uVar182 & uVar186);
                            }
                          }
                          if ((((pdVar50[lVar106 + lVar153 + lVar118] == 1.0) &&
                               (!NAN(pdVar50[lVar106 + lVar153 + lVar118]))) &&
                              (pdVar50[lVar116 + lVar153 + lVar118] == 1.0)) &&
                             (!NAN(pdVar50[lVar116 + lVar153 + lVar118]))) {
                            dVar208 = dVar201 - pdVar32[lVar129 + lVar124 + lVar115 + lVar119];
                            dVar210 = pdVar32[lVar142 + lVar124 + lVar115 + lVar119] - dVar201;
                            dVar208 = dVar208 + dVar208;
                            dVar210 = dVar210 + dVar210;
                            dVar197 = (pdVar32[lVar142 + lVar124 + lVar115 + lVar119] -
                                      pdVar32[lVar129 + lVar124 + lVar115 + lVar119]) * 0.5;
                            dVar203 = ABS(dVar208);
                            uVar182 = -(ulong)(0.0 < dVar197);
                            dVar197 = ABS(dVar197);
                            dVar184 = ABS(dVar210);
                            if (dVar203 <= dVar197) {
                              dVar197 = dVar203;
                            }
                            if (dVar197 <= dVar184) {
                              dVar184 = dVar197;
                            }
                            uVar186 = -(ulong)(0.0 < dVar208 * dVar210) & (ulong)dVar184;
                            dVar197 = (double)(~uVar182 & (uVar186 ^ 0x8000000000000000) |
                                              uVar182 & uVar186);
                          }
                          if (((pdVar50[lVar100 + lVar118 + lVar154] == 1.0) &&
                              (!NAN(pdVar50[lVar100 + lVar118 + lVar154]))) &&
                             ((pdVar50[lVar100 + lVar118 + lVar156] == 1.0 &&
                              (!NAN(pdVar50[lVar100 + lVar118 + lVar156]))))) {
                            dVar208 = pdVar32[lVar105 + lVar119 + lVar166 + lVar115] - dVar201;
                            dVar203 = (dVar201 - dVar212) + (dVar201 - dVar212);
                            dVar208 = dVar208 + dVar208;
                            dVar199 = (pdVar32[lVar105 + lVar119 + lVar166 + lVar115] - dVar212) *
                                      0.5;
                            dVar210 = ABS(dVar203);
                            uVar182 = -(ulong)(0.0 < dVar199);
                            dVar199 = ABS(dVar199);
                            dVar184 = ABS(dVar208);
                            if (dVar210 <= dVar199) {
                              dVar199 = dVar210;
                            }
                            if (dVar199 <= dVar184) {
                              dVar184 = dVar199;
                            }
                            uVar186 = -(ulong)(0.0 < dVar203 * dVar208) & (ulong)dVar184;
                            dVar199 = (double)(~uVar182 & (uVar186 ^ 0x8000000000000000) |
                                              uVar182 & uVar186);
                          }
                        }
                        dVar184 = dVar212;
                        if (dVar201 <= dVar212) {
                          dVar184 = dVar201;
                        }
                        if (dVar212 <= dVar201) {
                          dVar212 = dVar201;
                        }
                        dVar209 = dVar209 - dVar188;
                        iVar113 = 0;
                        iVar88 = 0;
                        iVar147 = 0;
                        iVar176 = 0;
                        uVar152 = 0xffffffff;
                        do {
                          uVar89 = uVar152 + 1;
                          uVar140 = 0xffffffff;
                          iVar135 = iVar113;
                          do {
                            uVar1 = uVar140 + 1;
                            iVar122 = 5;
                            do {
                              if (((uVar29 >> (iVar122 + iVar135 & 0x1fU) & 1) != 0) &&
                                 ((iVar122 != 6 || uVar140 != 0) || uVar152 != 0)) {
                                iVar88 = iVar88 + (uint)((iVar122 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar140 == 0 && uVar152 == 0));
                                iVar147 = iVar147 + (uint)((iVar122 == 6 && uVar152 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar176 = iVar176 + (uint)((iVar122 == 6 && uVar140 == 0) &&
                                                          (uVar89 & 0xfffffffd) == 0);
                              }
                              iVar122 = iVar122 + 1;
                            } while (iVar122 != 8);
                            iVar135 = iVar135 + 3;
                            uVar140 = uVar1;
                          } while (uVar1 != 2);
                          iVar113 = iVar113 + 9;
                          uVar152 = uVar89;
                        } while (uVar89 != 2);
                        dVar203 = 2.0;
                        if ((uVar29 >> 0x15 & 1) != 0) {
                          lVar110 = -1;
                          cVar151 = '\b';
                          dVar203 = dVar201;
                          dVar208 = dVar201;
                          do {
                            iVar113 = 0;
                            bVar181 = true;
                            do {
                              bVar139 = bVar181;
                              lVar119 = 0;
                              dVar210 = dVar203;
                              do {
                                dVar203 = dVar210;
                                if (((int)lVar119 != 1 || (iVar113 != 0 || (int)lVar110 != 0)) &&
                                   ((1 << ((char)iVar113 * '\x03' + cVar151 + (char)lVar119 & 0x1fU)
                                    & uVar29) != 0)) {
                                  dVar211 = pdVar32[lVar115 + (iVar121 + (int)lVar110) * lVar34 +
                                                              (iVar86 + iVar113) * lVar33 +
                                                              (long)(iVar161 + (int)lVar119)];
                                  dVar203 = dVar211;
                                  if (dVar211 <= dVar210) {
                                    dVar203 = dVar210;
                                  }
                                  if (dVar211 < dVar208) {
                                    dVar208 = dVar211;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                                dVar210 = dVar203;
                              } while (lVar119 != 3);
                              iVar113 = 1;
                              bVar181 = false;
                            } while (bVar139);
                            lVar110 = lVar110 + 1;
                            cVar151 = cVar151 + '\t';
                          } while (lVar110 != 2);
                          dVar210 = (((pdVar42 + lVar145 + lVar125 + (lVar107 - lVar171))[lVar45] -
                                     dVar200) * dVar199 +
                                    (0.5 - dVar187) * dVar197 +
                                    (pdVar42[lVar145 + lVar125 + (lVar107 - lVar171)] - dVar188) *
                                    dVar195 + dVar201) - dVar201;
                          if (dVar210 <= 1e-13) {
                            dVar203 = 1.0;
                            if ((dVar210 < -1e-13) &&
                               (dVar203 = (dVar208 - dVar201) / dVar210, 1.0 <= dVar203)) {
                              dVar203 = 1.0;
                            }
                          }
                          else {
                            dVar203 = (dVar203 - dVar201) / dVar210;
                            if (1.0 <= dVar203) {
                              dVar203 = 1.0;
                            }
                          }
                          if (2.0 <= dVar203) {
                            dVar203 = 2.0;
                          }
                        }
                        dVar208 = dVar203;
                        if ((short)uVar29 < 0) {
                          lVar110 = -1;
                          cVar151 = '\x05';
                          dVar208 = dVar201;
                          dVar210 = dVar201;
                          do {
                            lVar119 = -1;
                            cVar130 = cVar151;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar119 != 0 || (int)lVar110 != 0))
                                   && ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                                  dVar211 = pdVar32[lVar115 + (iVar121 + (int)lVar110) * lVar34 +
                                                              (iVar86 + (int)lVar119) * lVar33 +
                                                              (long)(iVar161 + (int)lVar120)];
                                  dVar213 = dVar211;
                                  if (dVar211 <= dVar208) {
                                    dVar213 = dVar208;
                                  }
                                  dVar208 = dVar213;
                                  if (dVar211 < dVar210) {
                                    dVar210 = dVar211;
                                  }
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 3);
                              cVar130 = cVar130 + '\x03';
                              bVar181 = lVar119 != 0;
                              lVar119 = lVar119 + 1;
                            } while (bVar181);
                            lVar110 = lVar110 + 1;
                            cVar151 = cVar151 + '\t';
                          } while (lVar110 != 2);
                          dVar211 = (((pdVar42 + lVar146 + lVar125 + (lVar107 - lVar171))[lVar45] -
                                     dVar200) * dVar199 +
                                    (((pdVar42[lVar146 + lVar125 + (lVar107 - lVar171)] - dVar188) *
                                      dVar195 + dVar201) - (dVar187 + 0.5) * dVar197)) - dVar201;
                          if (dVar211 <= 1e-13) {
                            dVar208 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar208 = (dVar210 - dVar201) / dVar211, 1.0 <= dVar208)) {
                              dVar208 = 1.0;
                            }
                          }
                          else {
                            dVar208 = (dVar208 - dVar201) / dVar211;
                            if (1.0 <= dVar208) {
                              dVar208 = 1.0;
                            }
                          }
                          if (dVar203 <= dVar208) {
                            dVar208 = dVar203;
                          }
                        }
                        dVar203 = dVar208;
                        if ((uVar29 >> 0x13 & 1) != 0) {
                          lVar110 = -1;
                          dVar203 = dVar201;
                          dVar210 = dVar201;
                          do {
                            lVar119 = -1;
                            do {
                              iVar113 = 0;
                              dVar211 = dVar203;
                              bVar181 = true;
                              do {
                                bVar139 = bVar181;
                                dVar203 = dVar211;
                                if ((((int)lVar119 != 0 || (int)lVar110 != 0) || iVar113 != 0) &&
                                   ((1 << ((char)lVar119 * '\x03' + (char)lVar110 * '\t' + '\x12' +
                                           (char)iVar113 & 0x1fU) & uVar29) != 0)) {
                                  dVar213 = pdVar32[lVar115 + (iVar121 + (int)lVar110) * lVar34 +
                                                              (iVar86 + (int)lVar119) * lVar33 +
                                                              (long)(iVar113 + (iVar87 - iVar162))];
                                  dVar203 = dVar213;
                                  if (dVar213 <= dVar211) {
                                    dVar203 = dVar211;
                                  }
                                  if (dVar213 < dVar210) {
                                    dVar210 = dVar213;
                                  }
                                }
                                iVar113 = 1;
                                dVar211 = dVar203;
                                bVar181 = false;
                              } while (bVar139);
                              lVar119 = lVar119 + 1;
                            } while (lVar119 != 2);
                            lVar110 = lVar110 + 1;
                          } while (lVar110 != 2);
                          dVar211 = (((pdVar46 + lVar149 + lVar126 + ((iVar87 - iVar13) + 1))
                                      [lVar49] - dVar200) * dVar199 +
                                    (pdVar46[lVar149 + lVar126 + ((iVar87 - iVar13) + 1)] - dVar187)
                                    * dVar197 + (0.5 - dVar188) * dVar195 + dVar201) - dVar201;
                          if (dVar211 <= 1e-13) {
                            dVar203 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar203 = (dVar210 - dVar201) / dVar211, 1.0 <= dVar203)) {
                              dVar203 = 1.0;
                            }
                          }
                          else {
                            dVar203 = (dVar203 - dVar201) / dVar211;
                            if (1.0 <= dVar203) {
                              dVar203 = 1.0;
                            }
                          }
                          if (dVar208 <= dVar203) {
                            dVar203 = dVar208;
                          }
                        }
                        dVar208 = dVar203;
                        if ((uVar29 >> 0x11 & 1) != 0) {
                          lVar110 = -1;
                          cVar151 = '\x05';
                          dVar210 = dVar201;
                          dVar208 = dVar201;
                          do {
                            lVar119 = -1;
                            cVar130 = cVar151;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar119 != 0 || (int)lVar110 != 0))
                                   && ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                                  dVar211 = pdVar32[lVar115 + (iVar121 + (int)lVar110) * lVar34 +
                                                              (iVar86 + (int)lVar119) * lVar33 +
                                                              (long)(iVar161 + (int)lVar120)];
                                  dVar213 = dVar211;
                                  if (dVar211 <= dVar208) {
                                    dVar213 = dVar208;
                                  }
                                  dVar208 = dVar213;
                                  if (dVar211 < dVar210) {
                                    dVar210 = dVar211;
                                  }
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 2);
                              lVar119 = lVar119 + 1;
                              cVar130 = cVar130 + '\x03';
                            } while (lVar119 != 2);
                            lVar110 = lVar110 + 1;
                            cVar151 = cVar151 + '\t';
                          } while (lVar110 != 2);
                          dVar211 = (((pdVar46 + lVar149 + lVar126 + (lVar107 - iVar13))[lVar49] -
                                     dVar200) * dVar199 +
                                    (pdVar46[lVar149 + lVar126 + (lVar107 - iVar13)] - dVar187) *
                                    dVar197 + (dVar201 - (dVar188 + 0.5) * dVar195)) - dVar201;
                          if (dVar211 <= 1e-13) {
                            dVar208 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar208 = (dVar210 - dVar201) / dVar211, 1.0 <= dVar208)) {
                              dVar208 = 1.0;
                            }
                          }
                          else {
                            dVar208 = (dVar208 - dVar201) / dVar211;
                            if (1.0 <= dVar208) {
                              dVar208 = 1.0;
                            }
                          }
                          if (dVar203 <= dVar208) {
                            dVar208 = dVar203;
                          }
                        }
                        dVar203 = dVar208;
                        if ((uVar29 >> 0x1b & 1) != 0) {
                          iVar113 = 0;
                          dVar210 = dVar201;
                          dVar203 = dVar201;
                          bVar181 = true;
                          do {
                            bVar139 = bVar181;
                            iVar135 = iVar113 * 9 + 0xe;
                            lVar110 = -1;
                            do {
                              lVar119 = 0;
                              dVar211 = dVar203;
                              do {
                                dVar203 = dVar211;
                                if (((int)lVar119 != 1 || ((int)lVar110 != 0 || iVar113 != 0)) &&
                                   ((1 << ((char)iVar135 + (char)lVar119 & 0x1fU) & uVar29) != 0)) {
                                  dVar213 = pdVar32[lVar115 + (iVar121 + iVar113) * lVar34 +
                                                              (iVar86 + (int)lVar110) * lVar33 +
                                                              (long)(iVar161 + (int)lVar119)];
                                  dVar203 = dVar213;
                                  if (dVar213 <= dVar211) {
                                    dVar203 = dVar211;
                                  }
                                  if (dVar213 < dVar210) {
                                    dVar210 = dVar213;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                                dVar211 = dVar203;
                              } while (lVar119 != 3);
                              lVar110 = lVar110 + 1;
                              iVar135 = iVar135 + 3;
                            } while (lVar110 != 2);
                            iVar113 = 1;
                            bVar181 = false;
                          } while (bVar139);
                          dVar188 = ((0.5 - dVar200) * dVar199 +
                                    ((pdVar38 + lVar103 + lVar109 + (iVar131 - iVar10) * lVar40)
                                     [lVar41] - dVar187) * dVar197 +
                                    (pdVar38[lVar103 + lVar109 + (iVar131 - iVar10) * lVar40] -
                                    dVar188) * dVar195 + dVar201) - dVar201;
                          if (dVar188 <= 1e-13) {
                            dVar203 = 1.0;
                            if ((dVar188 < -1e-13) &&
                               (dVar203 = (dVar210 - dVar201) / dVar188, 1.0 <= dVar203)) {
                              dVar203 = 1.0;
                            }
                          }
                          else {
                            dVar203 = (dVar203 - dVar201) / dVar188;
                            if (1.0 <= dVar203) {
                              dVar203 = 1.0;
                            }
                          }
                          if (dVar208 <= dVar203) {
                            dVar203 = dVar208;
                          }
                        }
                        cVar151 = '\x05';
                        lVar109 = -1;
                        dVar188 = dVar201;
                        dVar187 = dVar201;
                        do {
                          lVar110 = -1;
                          cVar130 = cVar151;
                          do {
                            lVar119 = 0;
                            do {
                              if (((int)lVar119 != 1 || ((int)lVar110 != 0 || (int)lVar109 != 0)) &&
                                 ((1 << (cVar130 + (char)lVar119 & 0x1fU) & uVar29) != 0)) {
                                dVar208 = pdVar32[lVar115 + (iVar121 + (int)lVar109) * lVar34 +
                                                            (iVar86 + (int)lVar110) * lVar33 +
                                                            (long)(iVar161 + (int)lVar119)];
                                dVar210 = dVar208;
                                if (dVar208 <= dVar187) {
                                  dVar210 = dVar187;
                                }
                                dVar187 = dVar210;
                                if (dVar208 < dVar188) {
                                  dVar188 = dVar208;
                                }
                              }
                              lVar119 = lVar119 + 1;
                            } while (lVar119 != 3);
                            lVar110 = lVar110 + 1;
                            cVar130 = cVar130 + '\x03';
                          } while (lVar110 != 2);
                          cVar151 = cVar151 + '\t';
                          bVar181 = lVar109 != 0;
                          lVar109 = lVar109 + 1;
                        } while (bVar181);
                        dVar208 = ((dVar202 * dVar197 + dVar209 * dVar195 + dVar201) -
                                  (dVar200 + 0.5) * dVar199) - dVar201;
                        if (dVar208 <= 1e-13) {
                          dVar187 = 1.0;
                          if ((dVar208 < -1e-13) &&
                             (dVar187 = (dVar188 - dVar201) / dVar208, 1.0 <= dVar187)) {
                            dVar187 = 1.0;
                          }
                        }
                        else {
                          dVar187 = (dVar187 - dVar201) / dVar208;
                          if (1.0 <= dVar187) {
                            dVar187 = 1.0;
                          }
                        }
                        if (dVar203 <= dVar187) {
                          dVar187 = dVar203;
                        }
                        dVar188 = 0.0;
                        if (1 < iVar88) {
                          dVar188 = dVar187;
                        }
                        dVar203 = 0.0;
                        if (1 < iVar147) {
                          dVar203 = dVar187;
                        }
                        dVar208 = 0.0;
                        if (1 < iVar176) {
                          dVar208 = dVar187;
                        }
                        if ((dVar190 != 1.0) || (NAN(dVar190))) {
                          local_8a8 = pdVar50[lVar100 + lVar118 + lVar154];
                        }
                        else {
                          if ((((pdVar50[lVar100 + lVar153 + (int)(~uVar16 + iVar87)] == 1.0) &&
                               (!NAN(pdVar50[lVar100 + lVar153 + (int)(~uVar16 + iVar87)]))) &&
                              (pdVar50[lVar100 + lVar153 + (int)((iVar87 - uVar16) + 1)] == 1.0)) &&
                             (!NAN(pdVar50[lVar100 + lVar153 + (int)((iVar87 - uVar16) + 1)]))) {
                            dVar188 = 1.0;
                          }
                          if (((pdVar50[lVar157 + lVar153 + lVar118] == 1.0) &&
                              (!NAN(pdVar50[lVar157 + lVar153 + lVar118]))) &&
                             ((pdVar50[lVar160 + lVar153 + lVar118] == 1.0 &&
                              (!NAN(pdVar50[lVar160 + lVar153 + lVar118]))))) {
                            dVar203 = 1.0;
                          }
                          local_8a8 = pdVar50[lVar100 + lVar118 + lVar154];
                          if ((local_8a8 == 1.0) && (!NAN(local_8a8))) {
                            if ((pdVar50[lVar100 + lVar118 + lVar127] != 1.0) ||
                               (NAN(pdVar50[lVar100 + lVar118 + lVar127]))) {
                              local_8a8 = 1.0;
                            }
                            else {
                              local_8a8 = 1.0;
                              dVar208 = 1.0;
                            }
                          }
                        }
                        dVar209 = dVar202 * dVar197 * dVar203 +
                                  dVar209 * dVar195 * dVar188 +
                                  -(dVar200 + 0.5) * dVar199 * dVar208 + dVar201;
                        if (dVar209 <= dVar212) {
                          dVar212 = dVar209;
                        }
                        if (dVar184 <= dVar212) {
                          dVar184 = dVar212;
                        }
                        dVar184 = pdVar64[lVar180 + lVar102 + (lVar107 - lVar148)] * dVar183 * -0.5
                                  * dVar199 * dVar208 + dVar184;
                        if ((local_8a8 == 1.0) && (!NAN(local_8a8))) goto LAB_0033eda9;
                        bVar181 = false;
LAB_0033f185:
                        lVar109 = lVar107 - lVar169;
                        dVar202 = pdVar38[lVar103 + lVar109 + lVar141];
                        dVar200 = (pdVar38 + lVar103 + lVar109 + lVar141)[lVar41];
                        pdVar137 = pdVar31 + iVar84 * lVar37 +
                                             (iVar132 - iVar5) * lVar36 + (long)(iVar87 - iVar177);
                        dVar188 = pdVar137[lVar30 * 2];
                        dVar187 = *pdVar137;
                        dVar201 = pdVar137[lVar30];
                        lVar110 = (long)(iVar87 - iVar162);
                        dVar212 = pdVar32[lVar105 + lVar110 + lVar179 + lVar115];
                        dVar195 = pdVar32[lVar105 + lVar110 + lVar94 + lVar115];
                        uVar29 = pEVar53[lVar99 + lVar108 + (lVar2 - lVar178) * lVar55].flag;
                        lVar119 = -1;
                        cVar151 = '\x05';
                        lVar108 = 0;
                        do {
                          iVar88 = (int)lVar119;
                          lVar120 = -1;
                          cVar130 = cVar151;
                          do {
                            iVar113 = (int)lVar120;
                            iVar147 = (int)lVar108;
                            ppdVar150 = &local_3b8.q.p + (long)iVar147 * 3;
                            lVar108 = 0;
                            do {
                              iVar176 = (int)lVar108 + -1;
                              if (((iVar113 == 0 && iVar88 == 0) && iVar176 == 0) ||
                                 ((1 << ((char)lVar108 + cVar130 & 0x1fU) & uVar29) == 0)) {
                                *ppdVar150 = (double *)0x0;
                                ppdVar150[1] = (double *)0x0;
                                ppdVar150[2] = (double *)0x0;
                              }
                              else {
                                pdVar137 = pdVar31 + (iVar84 + iVar88) * lVar37 +
                                                     ((iVar132 - iVar5) + iVar113) * lVar36 +
                                                     (long)(iVar80 + (int)lVar108);
                                dVar209 = pdVar137[lVar30];
                                *ppdVar150 = (double *)((*pdVar137 + (double)iVar176) - dVar187);
                                ppdVar150[1] = (double *)((dVar209 + (double)iVar113) - dVar201);
                                ppdVar150[2] = (double *)
                                               ((pdVar137[lVar30 * 2] + (double)iVar88) - dVar188);
                              }
                              lVar108 = lVar108 + 1;
                              ppdVar150 = ppdVar150 + 3;
                            } while (lVar108 != 3);
                            lVar120 = lVar120 + 1;
                            cVar130 = cVar130 + '\x03';
                            lVar108 = (long)iVar147 + 3;
                          } while (lVar120 != 2);
                          lVar119 = lVar119 + 1;
                          cVar151 = cVar151 + '\t';
                          lVar108 = (long)iVar147 + 3;
                        } while (lVar119 != 2);
                        lVar119 = -1;
                        cVar151 = '\x05';
                        lVar108 = 0;
                        do {
                          lVar120 = -1;
                          cVar130 = cVar151;
                          do {
                            iVar88 = (int)lVar108;
                            lVar108 = 0;
                            do {
                              dVar209 = 0.0;
                              if (((int)lVar108 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                                 ((1 << (cVar130 + (char)lVar108 & 0x1fU) & uVar29) != 0)) {
                                dVar209 = pdVar32[lVar115 + (iVar85 + (int)lVar119) * lVar34 +
                                                            (iVar86 + (int)lVar120) * lVar33 +
                                                            (long)(iVar161 + (int)lVar108)] -
                                          dVar195;
                              }
                              adStack_108[iVar88 + lVar108] = dVar209;
                              lVar108 = lVar108 + 1;
                            } while (lVar108 != 3);
                            lVar120 = lVar120 + 1;
                            cVar130 = cVar130 + '\x03';
                            lVar108 = (long)iVar88 + 3;
                          } while (lVar120 != 2);
                          lVar119 = lVar119 + 1;
                          cVar151 = cVar151 + '\t';
                          lVar108 = (long)iVar88 + 3;
                        } while (lVar119 != 2);
                        dVar200 = dVar200 - dVar201;
                        dVar199 = 0.0;
                        dVar203 = 0.0;
                        dVar185 = 0.0;
                        pLVar111 = &local_3b8.q.kstride;
                        lVar108 = 0;
                        dVar208 = 0.0;
                        dVar210 = 0.0;
                        dVar209 = 0.0;
                        dVar197 = 0.0;
                        dVar211 = 0.0;
                        dVar213 = 0.0;
                        do {
                          pdVar137 = ((Array4<const_double> *)(pLVar111 + -2))->p;
                          dVar206 = (double)pLVar111[-1];
                          dVar196 = adStack_108[lVar108];
                          dVar211 = dVar211 + (double)pdVar137 * (double)pdVar137;
                          dVar213 = dVar213 + dVar206 * dVar206;
                          dVar204 = (double)*pLVar111;
                          dVar185 = dVar185 + dVar206 * dVar204;
                          dVar199 = dVar199 + (double)pdVar137 * dVar196;
                          dVar203 = dVar203 + (double)pdVar137 * dVar204;
                          dVar208 = dVar208 + dVar206 * (double)pdVar137;
                          dVar210 = dVar210 + dVar196 * dVar206;
                          dVar209 = dVar209 + dVar204 * dVar196;
                          dVar197 = dVar197 + dVar204 * dVar204;
                          lVar108 = lVar108 + 1;
                          pLVar111 = pLVar111 + 3;
                        } while (lVar108 != 0x1b);
                        dVar207 = dVar197 * dVar208 + -dVar185 * dVar203;
                        dVar205 = dVar213 * dVar197 - dVar185 * dVar185;
                        dVar206 = dVar208 * dVar185 - dVar213 * dVar203;
                        dVar196 = dVar209 * dVar208 - dVar203 * dVar210;
                        dVar204 = dVar197 * dVar210 - dVar209 * dVar185;
                        auVar193._0_8_ =
                             dVar199 * dVar206 +
                             (dVar211 * (dVar213 * dVar209 - dVar185 * dVar210) - dVar208 * dVar196)
                        ;
                        auVar193._8_8_ =
                             dVar203 * (dVar210 * dVar185 - dVar213 * dVar209) +
                             (dVar199 * dVar205 - dVar208 * dVar204);
                        dVar197 = dVar206 * dVar203 + (dVar205 * dVar211 - dVar207 * dVar208);
                        auVar189._8_8_ = dVar197;
                        auVar189._0_8_ = dVar197;
                        dVar197 = (dVar196 * dVar203 + (dVar204 * dVar211 - dVar207 * dVar199)) /
                                  dVar197;
                        auVar194 = divpd(auVar193,auVar189);
                        if (bVar181) {
                          uVar182 = auVar194._8_8_;
                          if ((pdVar50[lVar100 + lVar154 + ((lVar107 + -1) - lVar164)] == 1.0) &&
                             (!NAN(pdVar50[lVar100 + lVar154 + ((lVar107 + -1) - lVar164)]))) {
                            if ((pdVar50[lVar100 + lVar154 + ((lVar107 + 1) - lVar164)] == 1.0) &&
                               (!NAN(pdVar50[lVar100 + lVar154 + ((lVar107 + 1) - lVar164)]))) {
                              dVar203 = dVar195 - pdVar32[lVar105 + lVar94 + lVar115 + ((lVar107 +
                                                                                        -1) - 
                                                  lVar175)];
                              dVar208 = pdVar32[lVar105 + lVar94 + lVar115 + ((lVar107 + 1) -
                                                                             lVar175)] - dVar195;
                              dVar203 = dVar203 + dVar203;
                              dVar208 = dVar208 + dVar208;
                              dVar209 = (pdVar32[lVar105 + lVar94 + lVar115 + ((lVar107 + 1) -
                                                                              lVar175)] -
                                        pdVar32[lVar105 + lVar94 + lVar115 + ((lVar107 + -1) -
                                                                             lVar175)]) * 0.5;
                              dVar210 = ABS(dVar203);
                              uVar182 = -(ulong)(0.0 < dVar209);
                              dVar209 = ABS(dVar209);
                              dVar199 = ABS(dVar208);
                              if (dVar210 <= dVar209) {
                                dVar209 = dVar210;
                              }
                              if (dVar209 <= dVar199) {
                                dVar199 = dVar209;
                              }
                              uVar186 = -(ulong)(0.0 < dVar203 * dVar208) & (ulong)dVar199;
                              uVar182 = ~uVar182 & (uVar186 ^ 0x8000000000000000) |
                                        uVar182 & uVar186;
                            }
                          }
                          if ((((pdVar50[lVar106 + lVar154 + lVar118] == 1.0) &&
                               (!NAN(pdVar50[lVar106 + lVar154 + lVar118]))) &&
                              (pdVar50[lVar116 + lVar154 + lVar118] == 1.0)) &&
                             (!NAN(pdVar50[lVar116 + lVar154 + lVar118]))) {
                            dVar199 = dVar195 - pdVar32[lVar129 + lVar94 + lVar115 + lVar110];
                            dVar203 = pdVar32[lVar142 + lVar94 + lVar115 + lVar110] - dVar195;
                            dVar199 = dVar199 + dVar199;
                            dVar203 = dVar203 + dVar203;
                            dVar209 = (pdVar32[lVar142 + lVar94 + lVar115 + lVar110] -
                                      pdVar32[lVar129 + lVar94 + lVar115 + lVar110]) * 0.5;
                            dVar208 = ABS(dVar199);
                            uVar186 = -(ulong)(0.0 < dVar209);
                            dVar209 = ABS(dVar209);
                            dVar197 = ABS(dVar203);
                            if (dVar208 <= dVar209) {
                              dVar209 = dVar208;
                            }
                            if (dVar209 <= dVar197) {
                              dVar197 = dVar209;
                            }
                            uVar198 = -(ulong)(0.0 < dVar199 * dVar203) & (ulong)dVar197;
                            dVar197 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                              uVar186 & uVar198);
                          }
                          auVar194._8_8_ = uVar182;
                          if (((dVar190 == 1.0) && (!NAN(dVar190))) &&
                             ((pdVar50[lVar100 + lVar118 + lVar155] == 1.0 &&
                              (!NAN(pdVar50[lVar100 + lVar118 + lVar155]))))) {
                            dVar208 = dVar195 - pdVar32[lVar105 + lVar110 + lVar167 + lVar115];
                            dVar203 = (dVar212 - dVar195) + (dVar212 - dVar195);
                            dVar208 = dVar208 + dVar208;
                            dVar209 = (dVar212 - pdVar32[lVar105 + lVar110 + lVar167 + lVar115]) *
                                      0.5;
                            dVar210 = ABS(dVar208);
                            uVar186 = -(ulong)(0.0 < dVar209);
                            dVar209 = ABS(dVar209);
                            dVar199 = ABS(dVar203);
                            if (dVar210 <= dVar209) {
                              dVar209 = dVar210;
                            }
                            if (dVar209 <= dVar199) {
                              dVar199 = dVar209;
                            }
                            uVar198 = -(ulong)(0.0 < dVar208 * dVar203) & (ulong)dVar199;
                            auVar194._0_8_ =
                                 ~uVar186 & (uVar198 ^ 0x8000000000000000) | uVar186 & uVar198;
                          }
                        }
                        dVar209 = dVar195;
                        if (dVar212 <= dVar195) {
                          dVar209 = dVar212;
                        }
                        dVar199 = dVar195;
                        if (dVar195 <= dVar212) {
                          dVar199 = dVar212;
                        }
                        dVar202 = dVar202 - dVar187;
                        iVar147 = 0;
                        iVar88 = 0;
                        iVar113 = 0;
                        iVar176 = 0;
                        uVar152 = 0xffffffff;
                        do {
                          uVar89 = uVar152 + 1;
                          uVar140 = 0xffffffff;
                          iVar135 = iVar147;
                          do {
                            uVar1 = uVar140 + 1;
                            iVar122 = 5;
                            do {
                              if (((uVar29 >> (iVar122 + iVar135 & 0x1fU) & 1) != 0) &&
                                 ((iVar122 != 6 || uVar140 != 0) || uVar152 != 0)) {
                                iVar88 = iVar88 + (uint)((iVar122 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar140 == 0 && uVar152 == 0));
                                iVar113 = iVar113 + (uint)((iVar122 == 6 && uVar152 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar176 = iVar176 + (uint)((iVar122 == 6 && uVar140 == 0) &&
                                                          (uVar89 & 0xfffffffd) == 0);
                              }
                              iVar122 = iVar122 + 1;
                            } while (iVar122 != 8);
                            iVar135 = iVar135 + 3;
                            uVar140 = uVar1;
                          } while (uVar1 != 2);
                          iVar147 = iVar147 + 9;
                          uVar152 = uVar89;
                        } while (uVar89 != 2);
                        dVar208 = auVar194._8_8_;
                        dVar212 = 2.0;
                        dVar203 = auVar194._0_8_;
                        if ((uVar29 >> 0x15 & 1) != 0) {
                          lVar108 = -1;
                          cVar151 = '\b';
                          dVar212 = dVar195;
                          dVar210 = dVar195;
                          do {
                            iVar147 = 0;
                            bVar181 = true;
                            do {
                              bVar139 = bVar181;
                              lVar110 = 0;
                              dVar211 = dVar212;
                              do {
                                dVar212 = dVar211;
                                if (((int)lVar110 != 1 || (iVar147 != 0 || (int)lVar108 != 0)) &&
                                   ((1 << ((char)iVar147 * '\x03' + cVar151 + (char)lVar110 & 0x1fU)
                                    & uVar29) != 0)) {
                                  dVar213 = pdVar32[lVar115 + (iVar85 + (int)lVar108) * lVar34 +
                                                              (iVar86 + iVar147) * lVar33 +
                                                              (long)(iVar161 + (int)lVar110)];
                                  dVar212 = dVar213;
                                  if (dVar213 <= dVar211) {
                                    dVar212 = dVar211;
                                  }
                                  if (dVar213 < dVar210) {
                                    dVar210 = dVar213;
                                  }
                                }
                                lVar110 = lVar110 + 1;
                                dVar211 = dVar212;
                              } while (lVar110 != 3);
                              iVar147 = 1;
                              bVar181 = false;
                            } while (bVar139);
                            lVar108 = lVar108 + 1;
                            cVar151 = cVar151 + '\t';
                          } while (lVar108 != 2);
                          dVar211 = (((pdVar42 + lVar145 + lVar95 + (lVar107 - lVar171))[lVar45] -
                                     dVar188) * dVar203 +
                                    (0.5 - dVar201) * dVar197 +
                                    (pdVar42[lVar145 + lVar95 + (lVar107 - lVar171)] - dVar187) *
                                    dVar208 + dVar195) - dVar195;
                          if (dVar211 <= 1e-13) {
                            dVar212 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar212 = (dVar210 - dVar195) / dVar211, 1.0 <= dVar212)) {
                              dVar212 = 1.0;
                            }
                          }
                          else {
                            dVar212 = (dVar212 - dVar195) / dVar211;
                            if (1.0 <= dVar212) {
                              dVar212 = 1.0;
                            }
                          }
                          if (2.0 <= dVar212) {
                            dVar212 = 2.0;
                          }
                        }
                        dVar210 = dVar212;
                        if ((short)uVar29 < 0) {
                          lVar110 = -1;
                          cVar151 = '\x05';
                          lVar108 = lVar117;
                          dVar211 = dVar195;
                          dVar210 = dVar195;
                          do {
                            lVar119 = -1;
                            lVar120 = lVar108;
                            cVar130 = cVar151;
                            do {
                              lVar133 = 0;
                              do {
                                if (((int)lVar133 != 1 || ((int)lVar119 != 0 || (int)lVar110 != 0))
                                   && ((1 << (cVar130 + (char)lVar133 & 0x1fU) & uVar29) != 0)) {
                                  dVar213 = *(double *)(lVar120 + lVar133 * 8);
                                  dVar185 = dVar213;
                                  if (dVar213 <= dVar210) {
                                    dVar185 = dVar210;
                                  }
                                  dVar210 = dVar185;
                                  if (dVar213 < dVar211) {
                                    dVar211 = dVar213;
                                  }
                                }
                                lVar133 = lVar133 + 1;
                              } while (lVar133 != 3);
                              lVar120 = lVar120 + lVar33 * 8;
                              cVar130 = cVar130 + '\x03';
                              bVar181 = lVar119 != 0;
                              lVar119 = lVar119 + 1;
                            } while (bVar181);
                            lVar110 = lVar110 + 1;
                            lVar108 = lVar108 + lVar34 * 8;
                            cVar151 = cVar151 + '\t';
                          } while (lVar110 != 2);
                          dVar213 = (((pdVar42 + lVar146 + lVar95 + (lVar107 - lVar171))[lVar45] -
                                     dVar188) * dVar203 +
                                    (((pdVar42[lVar146 + lVar95 + (lVar107 - lVar171)] - dVar187) *
                                      dVar208 + dVar195) - (dVar201 + 0.5) * dVar197)) - dVar195;
                          if (dVar213 <= 1e-13) {
                            dVar210 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar210 = (dVar211 - dVar195) / dVar213, 1.0 <= dVar210)) {
                              dVar210 = 1.0;
                            }
                          }
                          else {
                            dVar210 = (dVar210 - dVar195) / dVar213;
                            if (1.0 <= dVar210) {
                              dVar210 = 1.0;
                            }
                          }
                          if (dVar212 <= dVar210) {
                            dVar210 = dVar212;
                          }
                        }
                        dVar212 = dVar210;
                        if ((uVar29 >> 0x13 & 1) != 0) {
                          lVar108 = -1;
                          dVar212 = dVar195;
                          dVar211 = dVar195;
                          do {
                            lVar110 = -1;
                            do {
                              iVar147 = 0;
                              dVar213 = dVar212;
                              bVar181 = true;
                              do {
                                bVar139 = bVar181;
                                dVar212 = dVar213;
                                if ((((int)lVar110 != 0 || (int)lVar108 != 0) || iVar147 != 0) &&
                                   ((1 << ((char)lVar110 * '\x03' + (char)lVar108 * '\t' + '\x12' +
                                           (char)iVar147 & 0x1fU) & uVar29) != 0)) {
                                  dVar185 = pdVar32[lVar115 + (iVar85 + (int)lVar108) * lVar34 +
                                                              (iVar86 + (int)lVar110) * lVar33 +
                                                              (long)(iVar147 + (iVar87 - iVar162))];
                                  dVar212 = dVar185;
                                  if (dVar185 <= dVar213) {
                                    dVar212 = dVar213;
                                  }
                                  if (dVar185 < dVar211) {
                                    dVar211 = dVar185;
                                  }
                                }
                                iVar147 = 1;
                                dVar213 = dVar212;
                                bVar181 = false;
                              } while (bVar139);
                              lVar110 = lVar110 + 1;
                            } while (lVar110 != 2);
                            lVar108 = lVar108 + 1;
                          } while (lVar108 != 2);
                          dVar213 = (((pdVar46 + lVar149 + lVar96 + ((iVar87 - iVar13) + 1))[lVar49]
                                     - dVar188) * dVar203 +
                                    (pdVar46[lVar149 + lVar96 + ((iVar87 - iVar13) + 1)] - dVar201)
                                    * dVar197 + (0.5 - dVar187) * dVar208 + dVar195) - dVar195;
                          if (dVar213 <= 1e-13) {
                            dVar212 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar212 = (dVar211 - dVar195) / dVar213, 1.0 <= dVar212)) {
                              dVar212 = 1.0;
                            }
                          }
                          else {
                            dVar212 = (dVar212 - dVar195) / dVar213;
                            if (1.0 <= dVar212) {
                              dVar212 = 1.0;
                            }
                          }
                          if (dVar210 <= dVar212) {
                            dVar212 = dVar210;
                          }
                        }
                        dVar210 = dVar212;
                        if ((uVar29 >> 0x11 & 1) != 0) {
                          lVar108 = -1;
                          cVar151 = '\x05';
                          dVar210 = dVar195;
                          dVar211 = dVar195;
                          do {
                            lVar110 = -1;
                            cVar130 = cVar151;
                            do {
                              lVar119 = 0;
                              do {
                                if (((int)lVar119 != 1 || ((int)lVar110 != 0 || (int)lVar108 != 0))
                                   && ((1 << (cVar130 + (char)lVar119 & 0x1fU) & uVar29) != 0)) {
                                  dVar213 = pdVar32[lVar115 + (iVar85 + (int)lVar108) * lVar34 +
                                                              (iVar86 + (int)lVar110) * lVar33 +
                                                              (long)(iVar161 + (int)lVar119)];
                                  dVar185 = dVar213;
                                  if (dVar213 <= dVar210) {
                                    dVar185 = dVar210;
                                  }
                                  dVar210 = dVar185;
                                  if (dVar213 < dVar211) {
                                    dVar211 = dVar213;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                              } while (lVar119 != 2);
                              lVar110 = lVar110 + 1;
                              cVar130 = cVar130 + '\x03';
                            } while (lVar110 != 2);
                            lVar108 = lVar108 + 1;
                            cVar151 = cVar151 + '\t';
                          } while (lVar108 != 2);
                          dVar213 = (((pdVar46 + lVar149 + lVar96 + (lVar107 - iVar13))[lVar49] -
                                     dVar188) * dVar203 +
                                    (pdVar46[lVar149 + lVar96 + (lVar107 - iVar13)] - dVar201) *
                                    dVar197 + (dVar195 - (dVar187 + 0.5) * dVar208)) - dVar195;
                          if (dVar213 <= 1e-13) {
                            dVar210 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar210 = (dVar211 - dVar195) / dVar213, 1.0 <= dVar210)) {
                              dVar210 = 1.0;
                            }
                          }
                          else {
                            dVar210 = (dVar210 - dVar195) / dVar213;
                            if (1.0 <= dVar210) {
                              dVar210 = 1.0;
                            }
                          }
                          if (dVar212 <= dVar210) {
                            dVar210 = dVar212;
                          }
                        }
                        dVar212 = dVar210;
                        if ((uVar29 >> 0x1b & 1) != 0) {
                          iVar147 = 0;
                          dVar211 = dVar195;
                          bVar181 = true;
                          dVar212 = dVar195;
                          do {
                            bVar139 = bVar181;
                            iVar135 = iVar147 * 9 + 0xe;
                            lVar108 = -1;
                            do {
                              lVar110 = 0;
                              do {
                                if (((int)lVar110 != 1 || ((int)lVar108 != 0 || iVar147 != 0)) &&
                                   ((1 << ((char)iVar135 + (char)lVar110 & 0x1fU) & uVar29) != 0)) {
                                  dVar213 = pdVar32[lVar115 + (iVar85 + iVar147) * lVar34 +
                                                              (iVar86 + (int)lVar108) * lVar33 +
                                                              (long)(iVar161 + (int)lVar110)];
                                  dVar185 = dVar213;
                                  if (dVar213 <= dVar212) {
                                    dVar185 = dVar212;
                                  }
                                  dVar212 = dVar185;
                                  if (dVar213 < dVar211) {
                                    dVar211 = dVar213;
                                  }
                                }
                                lVar110 = lVar110 + 1;
                              } while (lVar110 != 3);
                              lVar108 = lVar108 + 1;
                              iVar135 = iVar135 + 3;
                            } while (lVar108 != 2);
                            iVar147 = 1;
                            bVar181 = false;
                          } while (bVar139);
                          dVar213 = ((0.5 - dVar188) * dVar203 +
                                    dVar200 * dVar197 + dVar202 * dVar208 + dVar195) - dVar195;
                          if (dVar213 <= 1e-13) {
                            dVar212 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar212 = (dVar211 - dVar195) / dVar213, 1.0 <= dVar212)) {
                              dVar212 = 1.0;
                            }
                          }
                          else {
                            dVar212 = (dVar212 - dVar195) / dVar213;
                            if (1.0 <= dVar212) {
                              dVar212 = 1.0;
                            }
                          }
                          if (dVar210 <= dVar212) {
                            dVar212 = dVar210;
                          }
                        }
                        dVar210 = dVar212;
                        if ((uVar29 >> 9 & 1) != 0) {
                          cVar151 = '\x05';
                          lVar108 = -1;
                          dVar210 = dVar195;
                          dVar211 = dVar195;
                          do {
                            lVar110 = -1;
                            cVar130 = cVar151;
                            do {
                              lVar119 = 0;
                              do {
                                if (((int)lVar119 != 1 || ((int)lVar110 != 0 || (int)lVar108 != 0))
                                   && ((1 << (cVar130 + (char)lVar119 & 0x1fU) & uVar29) != 0)) {
                                  dVar213 = pdVar32[lVar115 + (iVar85 + (int)lVar108) * lVar34 +
                                                              (iVar86 + (int)lVar110) * lVar33 +
                                                              (long)(iVar161 + (int)lVar119)];
                                  dVar185 = dVar213;
                                  if (dVar213 <= dVar210) {
                                    dVar185 = dVar210;
                                  }
                                  dVar210 = dVar185;
                                  if (dVar213 < dVar211) {
                                    dVar211 = dVar213;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                              } while (lVar119 != 3);
                              lVar110 = lVar110 + 1;
                              cVar130 = cVar130 + '\x03';
                            } while (lVar110 != 2);
                            cVar151 = cVar151 + '\t';
                            bVar181 = lVar108 != 0;
                            lVar108 = lVar108 + 1;
                          } while (bVar181);
                          dVar187 = ((((pdVar38 + lVar103 + lVar109 + (lVar2 - iVar10) * lVar40)
                                       [lVar41] - dVar201) * dVar197 +
                                     (pdVar38[lVar103 + lVar109 + (lVar2 - iVar10) * lVar40] -
                                     dVar187) * dVar208 + dVar195) - (dVar188 + 0.5) * dVar203) -
                                    dVar195;
                          if (dVar187 <= 1e-13) {
                            dVar210 = 1.0;
                            if ((dVar187 < -1e-13) &&
                               (dVar210 = (dVar211 - dVar195) / dVar187, 1.0 <= dVar210)) {
                              dVar210 = 1.0;
                            }
                          }
                          else {
                            dVar210 = (dVar210 - dVar195) / dVar187;
                            if (1.0 <= dVar210) {
                              dVar210 = 1.0;
                            }
                          }
                          if (dVar212 <= dVar210) {
                            dVar210 = dVar212;
                          }
                        }
                        dVar187 = 0.0;
                        if (1 < iVar88) {
                          dVar187 = dVar210;
                        }
                        dVar201 = 0.0;
                        if (1 < iVar113) {
                          dVar201 = dVar210;
                        }
                        dVar212 = 0.0;
                        if (1 < iVar176) {
                          dVar212 = dVar210;
                        }
                        if ((local_8a8 == 1.0) && (!NAN(local_8a8))) {
                          if ((pdVar50[lVar100 + lVar154 + (int)(~uVar16 + iVar87)] == 1.0) &&
                             (((!NAN(pdVar50[lVar100 + lVar154 + (int)(~uVar16 + iVar87)]) &&
                               (pdVar50[lVar100 + lVar154 + (int)((iVar87 - uVar16) + 1)] == 1.0))
                              && (!NAN(pdVar50[lVar100 + lVar154 + (int)((iVar87 - uVar16) + 1)]))))
                             ) {
                            dVar187 = 1.0;
                          }
                          if (((pdVar50[lVar157 + lVar154 + lVar118] == 1.0) &&
                              (!NAN(pdVar50[lVar157 + lVar154 + lVar118]))) &&
                             ((pdVar50[lVar160 + lVar154 + lVar118] == 1.0 &&
                              (!NAN(pdVar50[lVar160 + lVar154 + lVar118]))))) {
                            dVar201 = 1.0;
                          }
                          if (((dVar190 == 1.0) && (!NAN(dVar190))) &&
                             ((pdVar50[lVar100 + lVar118 + lVar128] == 1.0 &&
                              (!NAN(pdVar50[lVar100 + lVar118 + lVar128]))))) {
                            dVar212 = 1.0;
                          }
                        }
                        dVar190 = (0.5 - dVar188) * dVar203 * dVar212 +
                                  dVar200 * dVar197 * dVar201 +
                                  dVar202 * dVar208 * dVar187 + dVar195;
                        if (dVar190 <= dVar199) {
                          dVar199 = dVar190;
                        }
                        if (dVar209 <= dVar199) {
                          dVar209 = dVar199;
                        }
                        dVar209 = pdVar64[lVar180 + lVar102 + (lVar107 - lVar148)] * dVar183 * -0.5
                                  * dVar203 * dVar212 + dVar209;
                      }
                      else {
                        dVar209 = pdVar50[lVar100 + lVar118 + lVar156];
                        if (((pdVar50[lVar100 + lVar118 + lVar155] != 1.0) ||
                            (NAN(pdVar50[lVar100 + lVar118 + lVar155]))) ||
                           ((dVar209 != 1.0 || (NAN(dVar209))))) {
                          if ((dVar209 != 1.0) || (NAN(dVar209))) goto LAB_0033d572;
LAB_0033eca4:
                          lVar109 = lVar107 - lVar175;
                          dVar209 = pdVar32[lVar101 + lVar109 + lVar179 + lVar115];
                          dVar188 = dVar209 - pdVar32[lVar101 + lVar109 + lVar165 + lVar115];
                          dVar187 = pdVar32[lVar101 + lVar109 + lVar166 + lVar115] - dVar209;
                          dVar188 = dVar188 + dVar188;
                          dVar187 = dVar187 + dVar187;
                          dVar184 = (pdVar32[lVar101 + lVar109 + lVar166 + lVar115] -
                                    pdVar32[lVar101 + lVar109 + lVar165 + lVar115]) * 0.5;
                          dVar200 = ABS(dVar188);
                          uVar182 = -(ulong)(0.0 < dVar184);
                          dVar184 = ABS(dVar184);
                          dVar202 = ABS(dVar187);
                          if (dVar200 <= dVar184) {
                            dVar184 = dVar200;
                          }
                          if (dVar184 <= dVar202) {
                            dVar202 = dVar184;
                          }
                          uVar186 = -(ulong)(0.0 < dVar188 * dVar187) & (ulong)dVar202;
                          dVar184 = (double)(~uVar182 & (uVar186 ^ 0x8000000000000000) |
                                            uVar182 & uVar186) *
                                    (-1.0 - pdVar64[lVar180 + lVar102 + (lVar107 - lVar148)] *
                                            dVar183) * 0.5;
                        }
                        else {
                          if ((pdVar50[lVar100 + lVar118 + ((lVar112 + 2) - lVar163) * lVar52] !=
                               1.0) || (NAN(pdVar50[lVar100 + lVar118 + ((lVar112 + 2) - lVar163) *
                                                                        lVar52])))
                          goto LAB_0033eca4;
                          lVar109 = lVar107 - lVar175;
                          dVar209 = pdVar32[lVar101 + lVar109 + lVar179 + lVar115];
                          dVar200 = dVar209 - pdVar32[lVar101 + lVar109 + lVar165 + lVar115];
                          dVar188 = pdVar32[lVar101 + lVar109 + lVar165 + lVar115] -
                                    pdVar32[lVar101 + lVar109 + lVar167 + lVar115];
                          dVar184 = 0.0;
                          dVar202 = 0.0;
                          if (0.0 <= dVar200 * dVar188) {
                            dVar202 = ABS(dVar200);
                            if (ABS(dVar188) <= ABS(dVar200)) {
                              dVar202 = ABS(dVar188);
                            }
                            dVar202 = dVar202 + dVar202;
                          }
                          dVar201 = pdVar32[lVar101 + lVar109 + ((lVar112 + 2) - lVar92) * lVar34 +
                                                                lVar115] -
                                    pdVar32[lVar101 + lVar109 + lVar166 + lVar115];
                          dVar212 = pdVar32[lVar101 + lVar109 + lVar166 + lVar115] - dVar209;
                          dVar187 = (dVar212 + dVar201) * 0.5;
                          if (0.0 <= dVar212 * dVar201) {
                            dVar184 = ABS(dVar201);
                            if (ABS(dVar212) <= ABS(dVar201)) {
                              dVar184 = ABS(dVar212);
                            }
                            dVar184 = dVar184 + dVar184;
                          }
                          dVar195 = (dVar200 + dVar212) * 0.5;
                          dVar201 = 0.0;
                          if (0.0 <= dVar200 * dVar212) {
                            dVar201 = ABS(dVar212);
                            if (ABS(dVar200) <= ABS(dVar212)) {
                              dVar201 = ABS(dVar200);
                            }
                            dVar201 = dVar201 + dVar201;
                          }
                          dVar188 = (dVar200 + dVar188) * 0.5;
                          dVar200 = ABS(dVar188);
                          if (dVar202 <= dVar200) {
                            dVar200 = dVar202;
                          }
                          dVar202 = ABS(dVar187);
                          if (dVar184 <= dVar202) {
                            dVar202 = dVar184;
                          }
                          dVar184 = ABS(dVar195 * 1.3333333333333333 +
                                        (dVar202 * (double)((ulong)dVar187 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar200 * (double)((ulong)dVar188 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar201 <= dVar184) {
                            dVar184 = dVar201;
                          }
                          dVar184 = dVar184 * (double)((ulong)dVar195 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (-1.0 - pdVar64[lVar180 + lVar102 + (lVar107 - lVar148)] *
                                            dVar183) * 0.5;
                        }
                        dVar184 = dVar184 + dVar209;
LAB_0033eda9:
                        dVar209 = pdVar50[lVar100 + lVar118 + lVar128];
                        if ((((dVar209 != 1.0) || (NAN(dVar209))) ||
                            (pdVar50[lVar100 + lVar118 + ((iVar174 + -3) - iVar15) * lVar52] != 1.0)
                            ) || (NAN(pdVar50[lVar100 + lVar118 + ((iVar174 + -3) - iVar15) * lVar52
                                             ]))) {
                          if (((dVar190 != 1.0) || (NAN(dVar190))) ||
                             ((dVar209 != 1.0 || (NAN(dVar209))))) goto LAB_0033f175;
LAB_0033f06c:
                          lVar108 = lVar107 - lVar175;
                          dVar190 = pdVar32[lVar101 + lVar108 + lVar165 + lVar115];
                          dVar200 = dVar190 - pdVar32[lVar101 + lVar108 + lVar93 + lVar115];
                          dVar188 = pdVar32[lVar101 + lVar108 + lVar179 + lVar115] - dVar190;
                          dVar200 = dVar200 + dVar200;
                          dVar188 = dVar188 + dVar188;
                          dVar202 = (pdVar32[lVar101 + lVar108 + lVar179 + lVar115] -
                                    pdVar32[lVar101 + lVar108 + lVar93 + lVar115]) * 0.5;
                          dVar187 = ABS(dVar200);
                          uVar182 = -(ulong)(0.0 < dVar202);
                          dVar202 = ABS(dVar202);
                          dVar209 = ABS(dVar188);
                          if (dVar187 <= dVar202) {
                            dVar202 = dVar187;
                          }
                          if (dVar202 <= dVar209) {
                            dVar209 = dVar202;
                          }
                          uVar186 = -(ulong)(0.0 < dVar200 * dVar188) & (ulong)dVar209;
                          dVar209 = (double)(~uVar182 & (uVar186 ^ 0x8000000000000000) |
                                            uVar182 & uVar186) *
                                    (1.0 - pdVar64[lVar180 + lVar102 + (lVar107 - lVar148)] *
                                           dVar183) * 0.5;
                        }
                        else {
                          if ((dVar190 != 1.0) || (NAN(dVar190))) {
LAB_0033f175:
                            bVar181 = true;
                            local_8a8 = 1.0;
                            goto LAB_0033f185;
                          }
                          if ((pdVar50[lVar100 + lVar118 + lVar127] != 1.0) ||
                             (NAN(pdVar50[lVar100 + lVar118 + lVar127]))) goto LAB_0033f06c;
                          lVar108 = lVar107 - lVar175;
                          dVar190 = pdVar32[lVar101 + lVar108 + lVar165 + lVar115];
                          dVar200 = dVar190 - pdVar32[lVar101 + lVar108 + lVar93 + lVar115];
                          dVar188 = pdVar32[lVar101 + lVar108 + lVar93 + lVar115] -
                                    pdVar32[lVar101 + lVar108 + ((iVar174 + -3) - iVar4) * lVar34 +
                                                                lVar115];
                          dVar202 = 0.0;
                          dVar209 = 0.0;
                          if (0.0 <= dVar200 * dVar188) {
                            dVar209 = ABS(dVar200);
                            if (ABS(dVar188) <= ABS(dVar200)) {
                              dVar209 = ABS(dVar188);
                            }
                            dVar209 = dVar209 + dVar209;
                          }
                          dVar187 = pdVar32[lVar101 + lVar108 + (iVar131 - iVar4) * lVar34 + lVar115
                                           ] - pdVar32[lVar101 + lVar108 + lVar179 + lVar115];
                          dVar212 = pdVar32[lVar101 + lVar108 + lVar179 + lVar115] - dVar190;
                          dVar201 = (dVar212 + dVar187) * 0.5;
                          if (0.0 <= dVar212 * dVar187) {
                            dVar202 = ABS(dVar187);
                            if (ABS(dVar212) <= ABS(dVar187)) {
                              dVar202 = ABS(dVar212);
                            }
                            dVar202 = dVar202 + dVar202;
                          }
                          dVar195 = (dVar200 + dVar212) * 0.5;
                          dVar187 = 0.0;
                          if (0.0 <= dVar200 * dVar212) {
                            dVar187 = ABS(dVar212);
                            if (ABS(dVar200) <= ABS(dVar212)) {
                              dVar187 = ABS(dVar200);
                            }
                            dVar187 = dVar187 + dVar187;
                          }
                          dVar188 = (dVar200 + dVar188) * 0.5;
                          dVar200 = ABS(dVar188);
                          if (dVar209 <= dVar200) {
                            dVar200 = dVar209;
                          }
                          dVar209 = ABS(dVar201);
                          if (dVar202 <= dVar209) {
                            dVar209 = dVar202;
                          }
                          dVar209 = ABS(dVar195 * 1.3333333333333333 +
                                        (dVar209 * (double)((ulong)dVar201 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar200 * (double)((ulong)dVar188 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar187 <= dVar209) {
                            dVar209 = dVar187;
                          }
                          dVar209 = dVar209 * (double)((ulong)dVar195 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (1.0 - pdVar64[lVar180 + lVar102 + (lVar107 - lVar148)] *
                                           dVar183) * 0.5;
                        }
                        dVar209 = dVar209 + dVar190;
                      }
                    }
                    pdVar56[local_890 * lVar59 +
                            (int)(iVar174 + ~uVar19) * lVar58 +
                            (lVar134 - iVar20) * lVar57 + (lVar107 - iVar21)] = dVar209;
                    pdVar60[local_890 * lVar63 +
                            (lVar112 - iVar22) * lVar62 +
                            (lVar134 - iVar23) * lVar61 + (lVar107 - iVar24)] = dVar184;
                    lVar107 = lVar107 + 1;
                    local_738 = local_738 + 1;
                    local_730 = local_730 + 1;
                    local_740 = local_740 + 1;
                    iVar161 = iVar161 + 1;
                    iVar80 = iVar80 + 1;
                    lVar117 = lVar117 + 8;
                  } while (iVar6 + 1 != (int)lVar107);
                }
                lVar134 = lVar134 + 1;
              } while ((int)uVar98 != iVar8 + 1);
            }
            lVar112 = lVar112 + 1;
          } while (iVar7 + 1 != (int)lVar112);
        }
        local_890 = local_890 + 1;
        local_810 = local_810 + lVar35;
      } while (local_890 != (uint)ncomp);
    }
  }
  else {
    local_3b8.q.p = q->p;
    local_3b8.q.jstride = q->jstride;
    local_3b8.q.kstride = q->kstride;
    local_3b8.q.nstride = q->nstride;
    local_3b8.q.begin.x = (q->begin).x;
    local_3b8.q.begin.y = (q->begin).y;
    uVar67 = *(undefined8 *)&(q->begin).z;
    uVar68 = (q->end).y;
    local_3b8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_3b8.q.begin.z = (int)uVar67;
    local_3b8.q.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.wmac.p = wmac->p;
    local_3b8.wmac.jstride = wmac->jstride;
    local_3b8.wmac.kstride = wmac->kstride;
    local_3b8.wmac.nstride = wmac->nstride;
    local_3b8.wmac.begin.x = (wmac->begin).x;
    local_3b8.wmac.begin.y = (wmac->begin).y;
    uVar69 = (wmac->end).x;
    uVar70 = (wmac->end).y;
    local_3b8.wmac._52_8_ = *(undefined8 *)&(wmac->end).z;
    local_3b8.wmac.begin.z = (int)*(undefined8 *)&(wmac->begin).z;
    local_3b8.Imz.p = Imz->p;
    local_3b8.Imz.jstride = Imz->jstride;
    local_3b8.Imz.kstride = Imz->kstride;
    local_3b8.Imz.nstride = Imz->nstride;
    local_3b8.Imz.begin.x = (Imz->begin).x;
    local_3b8.Imz.begin.y = (Imz->begin).y;
    uVar67 = *(undefined8 *)&(Imz->begin).z;
    uVar71 = (Imz->end).y;
    local_3b8.Imz._52_8_ = *(undefined8 *)&(Imz->end).z;
    local_3b8.Imz.begin.z = (int)uVar67;
    local_3b8.Imz.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.Ipz.p = Ipz->p;
    local_3b8.Ipz.jstride = Ipz->jstride;
    local_3b8.Ipz.kstride = Ipz->kstride;
    local_3b8.Ipz.nstride = Ipz->nstride;
    local_3b8.Ipz.begin.x = (Ipz->begin).x;
    local_3b8.Ipz.begin.y = (Ipz->begin).y;
    uVar72 = (Ipz->end).x;
    uVar73 = (Ipz->end).y;
    local_3b8.Ipz._52_8_ = *(undefined8 *)&(Ipz->end).z;
    local_3b8.Ipz.begin.z = (int)*(undefined8 *)&(Ipz->begin).z;
    local_3b8.pbc = pbc;
    local_3b8.flag.p = flag->p;
    local_3b8.flag.jstride = flag->jstride;
    local_3b8.flag.kstride = flag->kstride;
    local_3b8.flag.nstride = flag->nstride;
    local_3b8.flag.begin.x = (flag->begin).x;
    local_3b8.flag.begin.y = (flag->begin).y;
    uVar67 = *(undefined8 *)&(flag->begin).z;
    uVar74 = (flag->end).y;
    local_3b8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_3b8.flag.begin.z = (int)uVar67;
    local_3b8.flag.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.vfrac.p = vfrac->p;
    local_3b8.vfrac.jstride = vfrac->jstride;
    local_3b8.vfrac.kstride = vfrac->kstride;
    local_3b8.vfrac.nstride = vfrac->nstride;
    local_3b8.vfrac.begin.x = (vfrac->begin).x;
    local_3b8.vfrac.begin.y = (vfrac->begin).y;
    uVar67 = *(undefined8 *)&(vfrac->begin).z;
    uVar75 = (vfrac->end).y;
    local_3b8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_3b8.vfrac.begin.z = (int)uVar67;
    local_3b8.vfrac.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.ccc.p = ccc->p;
    local_3b8.ccc.jstride = ccc->jstride;
    local_3b8.ccc.kstride = ccc->kstride;
    local_3b8.ccc.nstride = ccc->nstride;
    local_3b8.ccc.begin.x = (ccc->begin).x;
    local_3b8.ccc.begin.y = (ccc->begin).y;
    uVar67 = *(undefined8 *)&(ccc->begin).z;
    uVar76 = (ccc->end).y;
    local_3b8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_3b8.ccc.begin.z = (int)uVar67;
    local_3b8.ccc.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.fcx.p = fcx->p;
    local_3b8.fcx.jstride = fcx->jstride;
    local_3b8.fcx.kstride = fcx->kstride;
    local_3b8.fcx.nstride = fcx->nstride;
    local_3b8.fcx.begin.x = (fcx->begin).x;
    local_3b8.fcx.begin.y = (fcx->begin).y;
    uVar67 = *(undefined8 *)&(fcx->begin).z;
    uVar77 = (fcx->end).y;
    local_3b8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_3b8.fcx.begin.z = (int)uVar67;
    local_3b8.fcx.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.fcy.p = fcy->p;
    local_3b8.fcy.jstride = fcy->jstride;
    local_3b8.fcy.kstride = fcy->kstride;
    local_3b8.fcy.nstride = fcy->nstride;
    local_3b8.fcy.begin.x = (fcy->begin).x;
    local_3b8.fcy.begin.y = (fcy->begin).y;
    uVar67 = *(undefined8 *)&(fcy->begin).z;
    uVar78 = (fcy->end).y;
    local_3b8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_3b8.fcy.begin.z = (int)uVar67;
    local_3b8.fcy.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.fcz.p = fcz->p;
    local_3b8.fcz.jstride = fcz->jstride;
    local_3b8.fcz.kstride = fcz->kstride;
    local_3b8.fcz.nstride = fcz->nstride;
    local_3b8.fcz.begin.x = (fcz->begin).x;
    local_3b8.fcz.begin.y = (fcz->begin).y;
    uVar67 = *(undefined8 *)&(fcz->begin).z;
    uVar79 = (fcz->end).y;
    local_3b8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_3b8.fcz.begin.z = (int)uVar67;
    local_3b8.fcz.end.x = (int)((ulong)uVar67 >> 0x20);
    local_3b8.is_velocity = is_velocity;
    if (0 < ncomp) {
      iVar6 = (zebox->smallend).vect[0];
      iVar7 = (zebox->smallend).vect[1];
      iVar8 = (zebox->smallend).vect[2];
      iVar9 = (zebox->bigend).vect[2];
      iVar10 = (zebox->bigend).vect[0];
      iVar11 = (zebox->bigend).vect[1];
      iVar136 = 0;
      local_3b8.q.end.y = uVar68;
      local_3b8.wmac.end.x = uVar69;
      local_3b8.wmac.end.y = uVar70;
      local_3b8.domain_ilo = iVar177;
      local_3b8.domain_jlo = iVar162;
      local_3b8.domain_klo = iVar4;
      local_3b8.domain_ihi = iVar168;
      local_3b8.domain_jhi = iVar3;
      local_3b8.domain_khi = iVar5;
      local_3b8.Imz.end.y = uVar71;
      local_3b8.Ipz.end.x = uVar72;
      local_3b8.Ipz.end.y = uVar73;
      local_3b8.dtdz = dVar183;
      local_3b8.flag.end.y = uVar74;
      local_3b8.vfrac.end.y = uVar75;
      local_3b8.ccc.end.y = uVar76;
      local_3b8.fcx.end.y = uVar77;
      local_3b8.fcy.end.y = uVar78;
      local_3b8.fcz.end.y = uVar79;
      do {
        iVar177 = iVar8;
        if (iVar8 <= iVar9) {
          do {
            iVar162 = iVar7;
            if (iVar7 <= iVar11) {
              do {
                iVar168 = iVar6;
                if (iVar6 <= iVar10) {
                  do {
                    PredictStateOnZFace::anon_class_688_19_da5fa63c::operator()
                              (&local_3b8,iVar168,iVar162,iVar177,iVar136);
                    iVar168 = iVar168 + 1;
                  } while (iVar10 + 1 != iVar168);
                }
                bVar181 = iVar162 != iVar11;
                iVar162 = iVar162 + 1;
              } while (bVar181);
            }
            bVar181 = iVar177 != iVar9;
            iVar177 = iVar177 + 1;
          } while (bVar181);
        }
        iVar136 = iVar136 + 1;
      } while (iVar136 != ncomp);
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnZFace ( Box const& zebox, int ncomp,
                             Array4<Real> const& Imz, Array4<Real> const& Ipz,
                             Array4<Real const> const& q,
                             Array4<Real const> const& wmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dz = geom.CellSize(1);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qpls = q(i,j,k-1,n);

                // Over-write all with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    qmns = q(i,j,k-1,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qmns = q(i,j,k,n);
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dt,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}